

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O3

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
ImageT<unsigned_char,_3U>::getSFloat
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          ImageT<unsigned_char,_3U> *this,uint32_t numChannels,uint32_t targetBits)

{
  byte bVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar2;
  uint uVar3;
  uint32_t uVar4;
  uint uVar5;
  uint32_t uVar6;
  uint uVar7;
  byte *__dest;
  ulong uVar8;
  uint uVar9;
  float fVar10;
  uint16_t outValue;
  float outValue_1;
  ushort local_50;
  allocator_type local_4d;
  uint local_4c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_48;
  float local_3c;
  ulong local_38;
  
  if (3 < numChannels) {
    __assert_fail("numChannels <= componentCount",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                  ,0x38e,
                  "virtual std::vector<uint8_t> ImageT<unsigned char, 3>::getSFloat(uint32_t, uint32_t) const [componentType = unsigned char, componentCount = 3]"
                 );
  }
  if ((targetBits != 0x10) && (targetBits != 0x20)) {
    __assert_fail("targetBits == 16 || targetBits == 32",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                  ,0x38f,
                  "virtual std::vector<uint8_t> ImageT<unsigned char, 3>::getSFloat(uint32_t, uint32_t) const [componentType = unsigned char, componentCount = 3]"
                 );
  }
  local_4c = targetBits >> 3;
  local_48 = __return_storage_ptr__;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (__return_storage_ptr__,
             (ulong)(local_4c * numChannels * (this->super_Image).height * (this->super_Image).width
                    ),&local_4d);
  uVar5 = (this->super_Image).height;
  pvVar2 = local_48;
  if (uVar5 != 0) {
    local_38 = (ulong)local_4c;
    uVar6 = (this->super_Image).width;
    uVar9 = 0;
    uVar4 = uVar6;
    do {
      if (uVar4 == 0) {
        uVar4 = 0;
      }
      else {
        uVar5 = 0;
        do {
          if (numChannels != 0) {
            uVar8 = 0;
            do {
              uVar7 = (this->super_Image).width * uVar9 + uVar5;
              bVar1 = this->pixels[uVar7].field_0.comps[uVar8];
              __dest = (pvVar2->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                       _M_impl.super__Vector_impl_data._M_start +
                       (uVar7 * numChannels + (int)uVar8) * local_4c;
              if (targetBits == 0x20) {
                local_3c = (float)bVar1;
                memcpy(__dest,&local_3c,local_38);
                pvVar2 = local_48;
              }
              else if (targetBits == 0x10) {
                fVar10 = (float)bVar1;
                uVar7 = (uint)fVar10 >> 0x17;
                if (uVar7 == 0) {
                  local_50 = 0;
                }
                else if (uVar7 == 0xff) {
                  local_50 = (((uint)fVar10 & 0x7fffff) != 0 | 0x3e) << 9;
                }
                else {
                  local_50 = 0x7c00;
                  if ((uint)fVar10 < 0x47800000) {
                    if ((uint)fVar10 < 0x38800000) {
                      if ((uint)fVar10 < 0x33000000) {
                        local_50 = 0;
                        goto LAB_0019c4e2;
                      }
                      uVar3 = (uint)fVar10 & 0x7fffff | 0x800000;
                      local_50 = (ushort)(uVar3 >> (0x7eU - (char)uVar7 & 0x1f));
                      uVar3 = uVar3 >> ((byte)(0x7d - (char)uVar7) & 0x1f);
                    }
                    else {
                      local_50 = ((ushort)((uint)fVar10 >> 0xd) & 0x3ff |
                                 (ushort)((uVar7 & 0x1f) << 10)) ^ 0x4000;
                      uVar3 = (uint)fVar10 >> 0xc;
                    }
                    local_50 = local_50 + ((uVar3 & 1) != 0);
                  }
LAB_0019c4e2:
                  local_50 = local_50 & 0x7fff;
                }
                memcpy(__dest,&local_50,local_38);
                pvVar2 = local_48;
              }
              else if (targetBits == 8) {
                *__dest = bVar1;
              }
              uVar8 = uVar8 + 1;
            } while (numChannels != uVar8);
            uVar6 = (this->super_Image).width;
          }
          uVar5 = uVar5 + 1;
        } while (uVar5 < uVar6);
        uVar5 = (this->super_Image).height;
        uVar4 = uVar6;
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < uVar5);
  }
  return pvVar2;
}

Assistant:

virtual std::vector<uint8_t> getSFloat(uint32_t numChannels, uint32_t targetBits) const override {
        assert(numChannels <= componentCount);
        assert(targetBits == 16 || targetBits == 32);

        const uint32_t targetBytes = targetBits / 8;
        std::vector<uint8_t> data(height * width * numChannels * targetBytes);

        for (uint32_t y = 0; y < height; ++y) {
            for (uint32_t x = 0; x < width; ++x) {
                for (uint32_t c = 0; c < numChannels; ++c) {
                    const auto value = c < componentCount ? pixels[y * width + x][c] : (c != 3 ? componentType{0} : componentType{1});
                    auto* target = data.data() + (y * width * numChannels + x * numChannels + c) * targetBytes;

                    if (sizeof(componentType) == targetBytes) {
                        *reinterpret_cast<componentType*>(target) = value;
                    } else if (targetBytes == 2) {
                        const auto outValue = imageio::float_to_half(static_cast<float>(value));
                        std::memcpy(target, &outValue, targetBytes);
                    } else if (targetBytes == 4) {
                        const auto outValue = static_cast<float>(value);
                        std::memcpy(target, &outValue, targetBytes);
                    }
                }
            }
        }

        return data;
    }